

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser-basetype.cc
# Opt level: O1

bool __thiscall
tinyusdz::ascii::AsciiParser::SepBy1BasicType<tinyusdz::value::point3h>
          (AsciiParser *this,char sep,char end_symbol,
          vector<tinyusdz::value::point3h,_std::allocator<tinyusdz::value::point3h>_> *result)

{
  pointer *pppVar1;
  pointer ppVar2;
  iterator iVar3;
  StreamReader *pSVar4;
  undefined8 uVar5;
  bool bVar6;
  ulong uVar7;
  char cVar8;
  point3h value;
  point3h value_1;
  point3h local_56;
  undefined1 local_50 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  
  ppVar2 = (result->
           super__Vector_base<tinyusdz::value::point3h,_std::allocator<tinyusdz::value::point3h>_>).
           _M_impl.super__Vector_impl_data._M_start;
  if ((result->
      super__Vector_base<tinyusdz::value::point3h,_std::allocator<tinyusdz::value::point3h>_>).
      _M_impl.super__Vector_impl_data._M_finish != ppVar2) {
    (result->super__Vector_base<tinyusdz::value::point3h,_std::allocator<tinyusdz::value::point3h>_>
    )._M_impl.super__Vector_impl_data._M_finish = ppVar2;
  }
  bVar6 = SkipWhitespaceAndNewline(this,true);
  if (bVar6) {
    bVar6 = ReadBasicType(this,&local_56);
    if (bVar6) {
      iVar3._M_current =
           (result->
           super__Vector_base<tinyusdz::value::point3h,_std::allocator<tinyusdz::value::point3h>_>).
           _M_impl.super__Vector_impl_data._M_finish;
      if (iVar3._M_current ==
          (result->
          super__Vector_base<tinyusdz::value::point3h,_std::allocator<tinyusdz::value::point3h>_>).
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        ::std::vector<tinyusdz::value::point3h,std::allocator<tinyusdz::value::point3h>>::
        _M_realloc_insert<tinyusdz::value::point3h_const&>
                  ((vector<tinyusdz::value::point3h,std::allocator<tinyusdz::value::point3h>> *)
                   result,iVar3,&local_56);
      }
      else {
        ((iVar3._M_current)->z).value = local_56.z.value;
        (iVar3._M_current)->x = (half)local_56.x.value;
        (iVar3._M_current)->y = (half)local_56.y.value;
        pppVar1 = &(result->
                   super__Vector_base<tinyusdz::value::point3h,_std::allocator<tinyusdz::value::point3h>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
        *pppVar1 = *pppVar1 + 1;
      }
    }
    else {
      local_50._0_8_ = &local_40;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_50,"Not starting with the value of requested type.\n","");
      PushError(this,(string *)local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._0_8_ != &local_40) {
        operator_delete((void *)local_50._0_8_,local_40._M_allocated_capacity + 1);
      }
    }
    if (bVar6) {
      do {
        pSVar4 = this->_sr;
        if ((pSVar4->length_ <= pSVar4->idx_) || (pSVar4->binary_[pSVar4->idx_] == '\0'))
        goto LAB_00395081;
        bVar6 = SkipCommentAndWhitespaceAndNewline(this,true);
        if (!bVar6) {
          return false;
        }
        bVar6 = Char1(this,(char *)&local_56);
        cVar8 = '\x01';
        if (bVar6) {
          if ((char)local_56.x.value == sep) {
            bVar6 = SkipCommentAndWhitespaceAndNewline(this,true);
            if (bVar6) {
              bVar6 = LookChar1(this,local_50);
              cVar8 = (local_50[0] == end_symbol) * '\x03';
              if (!bVar6) {
                cVar8 = '\x01';
              }
              if (local_50[0] != end_symbol && bVar6) goto LAB_00394fec;
            }
          }
          else {
LAB_00394fec:
            if ((char)local_56.x.value == sep) {
              cVar8 = '\x01';
              bVar6 = SkipWhitespaceAndNewline(this,true);
              if (bVar6) {
                bVar6 = ReadBasicType(this,(point3h *)local_50);
                uVar5 = local_50._0_8_;
                cVar8 = '\x03';
                if (bVar6) {
                  iVar3._M_current =
                       (result->
                       super__Vector_base<tinyusdz::value::point3h,_std::allocator<tinyusdz::value::point3h>_>
                       )._M_impl.super__Vector_impl_data._M_finish;
                  if (iVar3._M_current ==
                      (result->
                      super__Vector_base<tinyusdz::value::point3h,_std::allocator<tinyusdz::value::point3h>_>
                      )._M_impl.super__Vector_impl_data._M_end_of_storage) {
                    ::std::vector<tinyusdz::value::point3h,std::allocator<tinyusdz::value::point3h>>
                    ::_M_realloc_insert<tinyusdz::value::point3h_const&>
                              ((vector<tinyusdz::value::point3h,std::allocator<tinyusdz::value::point3h>>
                                *)result,iVar3,(point3h *)local_50);
                  }
                  else {
                    ((iVar3._M_current)->z).value = local_50._4_2_;
                    (iVar3._M_current)->x = (half)local_50._0_2_;
                    (iVar3._M_current)->y = (half)local_50._2_2_;
                    pppVar1 = &(result->
                               super__Vector_base<tinyusdz::value::point3h,_std::allocator<tinyusdz::value::point3h>_>
                               )._M_impl.super__Vector_impl_data._M_finish;
                    *pppVar1 = *pppVar1 + 1;
                    local_50._0_8_ = uVar5;
                  }
                  cVar8 = '\0';
                }
              }
            }
            else {
              pSVar4 = this->_sr;
              cVar8 = '\x03';
              if ((0 < (long)pSVar4->idx_) && (uVar7 = pSVar4->idx_ - 1, uVar7 <= pSVar4->length_))
              {
                pSVar4->idx_ = uVar7;
              }
            }
          }
        }
      } while (cVar8 == '\0');
      if (cVar8 != '\x01') {
LAB_00395081:
        if ((result->
            super__Vector_base<tinyusdz::value::point3h,_std::allocator<tinyusdz::value::point3h>_>)
            ._M_impl.super__Vector_impl_data._M_start !=
            (result->
            super__Vector_base<tinyusdz::value::point3h,_std::allocator<tinyusdz::value::point3h>_>)
            ._M_impl.super__Vector_impl_data._M_finish) {
          return true;
        }
        local_50._0_8_ = &local_40;
        ::std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"Empty array.\n","");
        PushError(this,(string *)local_50);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._0_8_ != &local_40) {
          operator_delete((void *)local_50._0_8_,local_40._M_allocated_capacity + 1);
        }
      }
    }
  }
  return false;
}

Assistant:

bool AsciiParser::SepBy1BasicType(const char sep, const char end_symbol, std::vector<T> *result) {
  result->clear();

  if (!SkipWhitespaceAndNewline()) {
    return false;
  }

  {
    T value;
    if (!ReadBasicType(&value)) {
      PushError("Not starting with the value of requested type.\n");
      return false;
    }

    result->push_back(value);
  }

  while (!Eof()) {
    if (!SkipCommentAndWhitespaceAndNewline()) {
      return false;
    }

    // sep
    char c;
    if (!Char1(&c)) {
      return false;
    }

    if (c == sep) {
      // Look next token
      if (!SkipCommentAndWhitespaceAndNewline()) {
        return false;
      }

      char nc;
      if (!LookChar1(&nc)) {
        return false;
      }

      if (nc == end_symbol) {
        // end
        break;
      }
    }

    if (c != sep) {
      // end
      _sr->seek_from_current(-1);  // unwind single char
      break;
    }

    if (!SkipWhitespaceAndNewline()) {
      return false;
    }

    T value;
    if (!ReadBasicType(&value)) {
      break;
    }

    result->push_back(value);


  }

  if (result->empty()) {
    PushError("Empty array.\n");
    return false;
  }

  return true;
}